

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBootstrapCommands1.cxx
# Opt level: O2

void GetBootstrapCommands1(vector<cmCommand_*,_std::allocator<cmCommand_*>_> *commands)

{
  cmFindPackageCommand *pcVar1;
  cmFindPackageCommand *local_38;
  
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00595990;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00595a18;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00595aa0;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00595b28;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00595bb0;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00595c38;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00595cc0;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00595d48;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00595dd0;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00595e58;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmFindPackageCommand *)operator_new(0x68);
  cmCMakeMinimumRequired::cmCMakeMinimumRequired((cmCMakeMinimumRequired *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00595f78;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmFindPackageCommand *)operator_new(0xa0);
  cmConfigureFileCommand::cmConfigureFileCommand((cmConfigureFileCommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005960e8;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00596170;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmFindPackageCommand *)operator_new(0xb0);
  cmDefinePropertyCommand::cmDefinePropertyCommand((cmDefinePropertyCommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00596280;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00596308;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00596390;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00596418;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005964a0;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00596528;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005965b0;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00596638;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005966c0;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00596748;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00596800;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmFindPackageCommand *)operator_new(0x248);
  cmFindFileCommand::cmFindFileCommand((cmFindFileCommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmFindPackageCommand *)operator_new(0x248);
  cmFindLibraryCommand::cmFindLibraryCommand((cmFindLibraryCommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmFindPackageCommand *)operator_new(0x370);
  cmFindPackageCommand::cmFindPackageCommand(pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmFindPackageCommand *)operator_new(0x248);
  cmFindPathCommand::cmFindPathCommand((cmFindPathCommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmFindPackageCommand *)operator_new(0x248);
  cmFindProgramCommand::cmFindProgramCommand((cmFindProgramCommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005969e0;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00596ac8;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmFindPackageCommand *)operator_new(0x50);
  (local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_38->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_38->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00596bd8;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  return;
}

Assistant:

void GetBootstrapCommands1(std::vector<cmCommand*>& commands)
{
  commands.push_back(new cmAddCustomCommandCommand);
  commands.push_back(new cmAddCustomTargetCommand);
  commands.push_back(new cmAddDefinitionsCommand);
  commands.push_back(new cmAddDependenciesCommand);
  commands.push_back(new cmAddExecutableCommand);
  commands.push_back(new cmAddLibraryCommand);
  commands.push_back(new cmAddSubDirectoryCommand);
  commands.push_back(new cmAddTestCommand);
  commands.push_back(new cmBreakCommand);
  commands.push_back(new cmBuildCommand);
  commands.push_back(new cmCMakeMinimumRequired);
  commands.push_back(new cmCMakePolicyCommand);
  commands.push_back(new cmConfigureFileCommand);
  commands.push_back(new cmContinueCommand);
  commands.push_back(new cmCreateTestSourceList);
  commands.push_back(new cmDefinePropertyCommand);
  commands.push_back(new cmElseCommand);
  commands.push_back(new cmEnableLanguageCommand);
  commands.push_back(new cmEnableTestingCommand);
  commands.push_back(new cmEndForEachCommand);
  commands.push_back(new cmEndFunctionCommand);
  commands.push_back(new cmEndIfCommand);
  commands.push_back(new cmEndMacroCommand);
  commands.push_back(new cmEndWhileCommand);
  commands.push_back(new cmExecProgramCommand);
  commands.push_back(new cmExecuteProcessCommand);
  commands.push_back(new cmFileCommand);
  commands.push_back(new cmFindFileCommand);
  commands.push_back(new cmFindLibraryCommand);
  commands.push_back(new cmFindPackageCommand);
  commands.push_back(new cmFindPathCommand);
  commands.push_back(new cmFindProgramCommand);
  commands.push_back(new cmForEachCommand);
  commands.push_back(new cmFunctionCommand);
  commands.push_back(new cmParseArgumentsCommand);
}